

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayFreeArrayBufferHelper.cpp
# Opt level: O1

void __thiscall Js::DelayedFreeArrayBuffer::ClearAll(DelayedFreeArrayBuffer *this)

{
  Type pAVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *ppAVar5;
  Iterator local_40;
  
  if ((DelayedFreeArrayBuffer *)
      (this->listOfBuffers).
      super_SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>.
      super_SListNodeBase<Memory::HeapAllocator>.next != this) {
    local_40.list =
         (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *)
         this;
    local_40.current = (NodeBase *)this;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      if ((SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *
          )local_40.current ==
          (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *
          )0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      local_40.current =
           (((DelayedFreeBufferType *)&(local_40.current)->next)->
           super_SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
           ).super_SListNodeBase<Memory::HeapAllocator>.next;
      if ((SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *
          )local_40.current == local_40.list) break;
      ppAVar5 = SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
                ::Iterator::Data(&local_40);
      pAVar1 = *ppAVar5;
      (*pAVar1->_vptr_ArrayBufferContentForDelayedFreeBase[2])(pAVar1);
      (*pAVar1->_vptr_ArrayBufferContentForDelayedFreeBase[7])(pAVar1);
    }
    local_40.current = (NodeBase *)0x0;
    SList<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>::Clear
              (&this->listOfBuffers);
  }
  return;
}

Assistant:

void DelayedFreeArrayBuffer::ClearAll()
    {
        if (HasAnyItem())
        {
            this->listOfBuffers.Map([](Js::ArrayBufferContentForDelayedFreeBase* item) {
                item->Release();
                item->ClearSelfOnly();
            });

            this->listOfBuffers.Clear();
        }
    }